

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirePdu.cpp
# Opt level: O3

void __thiscall DIS::FirePdu::unmarshal(FirePdu *this,DataStream *dataStream)

{
  WarfareFamilyPdu::unmarshal(&this->super_WarfareFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_munitionID,dataStream);
  EventID::unmarshal(&this->_eventID,dataStream);
  DataStream::operator>>(dataStream,&this->_fireMissionIndex);
  Vector3Double::unmarshal(&this->_locationInWorldCoordinates,dataStream);
  BurstDescriptor::unmarshal(&this->_burstDescriptor,dataStream);
  Vector3Float::unmarshal(&this->_velocity,dataStream);
  DataStream::operator>>(dataStream,&this->_range);
  return;
}

Assistant:

void FirePdu::unmarshal(DataStream& dataStream)
{
    WarfareFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _munitionID.unmarshal(dataStream);
    _eventID.unmarshal(dataStream);
    dataStream >> _fireMissionIndex;
    _locationInWorldCoordinates.unmarshal(dataStream);
    _burstDescriptor.unmarshal(dataStream);
    _velocity.unmarshal(dataStream);
    dataStream >> _range;
}